

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack.cpp
# Opt level: O1

float PhPacker::__phpack__detail::php_pack_parse_float(int is_little_endian,char *src)

{
  undefined3 uVar1;
  
  if (is_little_endian == 0) {
    uVar1 = CONCAT12(src[1],*(ushort *)(src + 2) << 8 | *(ushort *)(src + 2) >> 8);
  }
  else {
    uVar1 = *(undefined3 *)src;
    src = src + 3;
  }
  return (float)CONCAT13(*src,uVar1);
}

Assistant:

float php_pack_parse_float(int is_little_endian, const char* src) noexcept
{
    char out[4] = {};
    if (!is_little_endian) {
        out[0] = src[3];
        out[1] = src[2];
        out[2] = src[1];
        out[3] = src[0];
    } else {
        out[0] = src[0];
        out[1] = src[1];
        out[2] = src[2];
        out[3] = src[3];
    }
    float f {};
    memcpy(&f, out, sizeof(float));
    return f;
}